

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::LoadStoreMachine::RunStage(LoadStoreMachine *this,int stage)

{
  bool bVar1;
  Vector<float,_4> local_1bc;
  Vector<float,_4> local_1ac;
  Vector<float,_4> local_19c;
  Vector<float,_4> local_18c;
  Vector<unsigned_int,_4> local_17c;
  Vector<unsigned_int,_4> local_16c;
  Vector<unsigned_int,_4> local_15c;
  Vector<unsigned_int,_4> local_14c;
  Vector<unsigned_int,_4> local_13c;
  Vector<unsigned_int,_4> local_12c;
  Vector<unsigned_int,_4> local_11c;
  Vector<unsigned_int,_4> local_10c;
  Vector<int,_4> local_fc;
  Vector<int,_4> local_ec;
  Vector<int,_4> local_dc;
  Vector<int,_4> local_cc;
  Vector<int,_4> local_bc;
  Vector<int,_4> local_ac;
  Vector<int,_4> local_9c;
  Vector<int,_4> local_8c;
  Vector<float,_4> local_7c;
  Vector<float,_4> local_6c;
  Vector<float,_4> local_5c;
  Vector<float,_4> local_4c;
  Vector<float,_4> local_3c;
  Vector<float,_4> local_2c;
  int local_1c;
  LoadStoreMachine *pLStack_18;
  int stage_local;
  LoadStoreMachine *this_local;
  
  this->m_stage = stage;
  local_1c = stage;
  pLStack_18 = this;
  bVar1 = ShaderImageLoadStoreBase::AreOutputsAvailable(&this->super_ShaderImageLoadStoreBase,5);
  if (bVar1) {
    tcu::Vector<float,_4>::Vector(&local_2c,1.0,2.0,3.0,4.0);
    tcu::Vector<float,_4>::Vector(&local_3c,1.0,2.0,3.0,4.0);
    bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                      ((LoadStoreMachine *)this,0x8814,&local_2c,&local_3c);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<float,_4>::Vector(&local_4c,1.0,2.0,3.0,4.0);
      tcu::Vector<float,_4>::Vector(&local_5c,1.0,0.0,0.0,1.0);
      bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                        ((LoadStoreMachine *)this,0x822e,&local_4c,&local_5c);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<float,_4>::Vector(&local_6c,1.0,2.0,3.0,4.0);
        tcu::Vector<float,_4>::Vector(&local_7c,1.0,2.0,3.0,4.0);
        bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                          ((LoadStoreMachine *)this,0x881a,&local_6c,&local_7c);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<int,_4>::Vector(&local_8c,1,-2,3,-4);
          tcu::Vector<int,_4>::Vector(&local_9c,1,-2,3,-4);
          bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                            ((LoadStoreMachine *)this,0x8d82,&local_8c,&local_9c);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<int,_4>::Vector(&local_ac,1,-2,3,-4);
            tcu::Vector<int,_4>::Vector(&local_bc,1,0,0,1);
            bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                              ((LoadStoreMachine *)this,0x8235,&local_ac,&local_bc);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              tcu::Vector<int,_4>::Vector(&local_cc,1,-2,3,-4);
              tcu::Vector<int,_4>::Vector(&local_dc,1,-2,3,-4);
              bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                                ((LoadStoreMachine *)this,0x8d88,&local_cc,&local_dc);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                tcu::Vector<int,_4>::Vector(&local_ec,1,-2,3,-4);
                tcu::Vector<int,_4>::Vector(&local_fc,1,-2,3,-4);
                bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                                  ((LoadStoreMachine *)this,0x8d8e,&local_ec,&local_fc);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  tcu::Vector<unsigned_int,_4>::Vector(&local_10c,0,1,2,3);
                  tcu::Vector<unsigned_int,_4>::Vector(&local_11c,0,1,2,3);
                  bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                          Write<tcu::Vector<unsigned_int,4>>
                                    ((LoadStoreMachine *)this,0x8d70,&local_10c,&local_11c);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    tcu::Vector<unsigned_int,_4>::Vector(&local_12c,7,2,3,4);
                    tcu::Vector<unsigned_int,_4>::Vector(&local_13c,7,0,0,1);
                    bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                            Write<tcu::Vector<unsigned_int,4>>
                                      ((LoadStoreMachine *)this,0x8236,&local_12c,&local_13c);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      tcu::Vector<unsigned_int,_4>::Vector(&local_14c,0,1,2,3);
                      tcu::Vector<unsigned_int,_4>::Vector(&local_15c,0,1,2,3);
                      bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                              Write<tcu::Vector<unsigned_int,4>>
                                        ((LoadStoreMachine *)this,0x8d76,&local_14c,&local_15c);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        tcu::Vector<unsigned_int,_4>::Vector(&local_16c,0,1,2,3);
                        tcu::Vector<unsigned_int,_4>::Vector(&local_17c,0,1,2,3);
                        bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                                Write<tcu::Vector<unsigned_int,4>>
                                          ((LoadStoreMachine *)this,0x8d7c,&local_16c,&local_17c);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          tcu::Vector<float,_4>::Vector(&local_18c,1.0);
                          tcu::Vector<float,_4>::Vector(&local_19c,1.0);
                          bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                                  Write<tcu::Vector<float,4>>
                                            ((LoadStoreMachine *)this,0x8058,&local_18c,&local_19c);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            tcu::Vector<float,_4>::Vector(&local_1ac,1.0,-1.0,1.0,-1.0);
                            tcu::Vector<float,_4>::Vector(&local_1bc,1.0,-1.0,1.0,-1.0);
                            bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                                    Write<tcu::Vector<float,4>>
                                              ((LoadStoreMachine *)this,0x8f97,&local_1ac,&local_1bc
                                              );
                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                              this_local = (LoadStoreMachine *)0x0;
                            }
                            else {
                              this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                            }
                          }
                          else {
                            this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (LoadStoreMachine *)0x10;
  }
  return (long)this_local;
}

Assistant:

long RunStage(int stage)
	{
		m_stage = stage;
		if (!AreOutputsAvailable(5))
			return NOT_SUPPORTED;

		if (!Write(GL_RGBA32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;
		if (!Write(GL_R32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Write(GL_RGBA16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;

		if (!Write(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_R32I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;
		if (!Write(GL_RGBA16I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_RGBA8I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;

		if (!Write(GL_RGBA32UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Write(GL_R32UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;
		if (!Write(GL_RGBA16UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Write(GL_RGBA8UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;

		if (!Write(GL_RGBA8, vec4(1.0f), vec4(1.0f)))
			return ERROR;

		if (!Write(GL_RGBA8_SNORM, vec4(1.0f, -1.0f, 1.0f, -1.0f), vec4(1.0f, -1.0f, 1.0f, -1.0f)))
			return ERROR;

		return NO_ERROR;
	}